

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

Vec_Ptr_t * Llb_ManCutSupps(Aig_Man_t *p,Vec_Ptr_t *vResult)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *Entry;
  int local_3c;
  int i;
  Vec_Ptr_t *vUpper;
  Vec_Ptr_t *vLower;
  Vec_Ptr_t *vOne;
  Vec_Ptr_t *vSupps;
  Vec_Ptr_t *vResult_local;
  Aig_Man_t *p_local;
  
  p_00 = Vec_PtrAlloc(100);
  pVVar3 = Vec_PtrAlloc(0);
  Vec_PtrPush(p_00,pVVar3);
  vUpper = (Vec_Ptr_t *)Vec_PtrEntry(vResult,0);
  for (local_3c = 1; iVar1 = Vec_PtrSize(vResult), local_3c < iVar1; local_3c = local_3c + 1) {
    pVVar3 = (Vec_Ptr_t *)Vec_PtrEntry(vResult,local_3c);
    Entry = Llb_ManCutSupp(p,vUpper,pVVar3);
    Vec_PtrPush(p_00,Entry);
    vUpper = pVVar3;
  }
  iVar1 = Vec_PtrSize(p_00);
  iVar2 = Vec_PtrSize(vResult);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_PtrSize(vSupps) == Vec_PtrSize(vResult)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                  ,0x4a,"Vec_Ptr_t *Llb_ManCutSupps(Aig_Man_t *, Vec_Ptr_t *)");
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Llb_ManCutSupps( Aig_Man_t * p, Vec_Ptr_t * vResult )
{
    Vec_Ptr_t * vSupps, * vOne, * vLower, * vUpper;
    int i;
    vSupps = Vec_PtrAlloc( 100 );
    Vec_PtrPush( vSupps, Vec_PtrAlloc(0) );
    vLower = (Vec_Ptr_t *)Vec_PtrEntry( vResult, 0 );
    Vec_PtrForEachEntryStart( Vec_Ptr_t *, vResult, vUpper, i, 1 )
    {
        vOne  = Llb_ManCutSupp( p, vLower, vUpper );
        Vec_PtrPush( vSupps, vOne );
        vLower = vUpper;
    }
    assert( Vec_PtrSize(vSupps) == Vec_PtrSize(vResult) );
    return vSupps;
}